

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O3

void PVG_FT_Stroker_Set(PVG_FT_Stroker stroker,PVG_FT_Fixed radius,PVG_FT_Stroker_LineCap line_cap,
                       PVG_FT_Stroker_LineJoin line_join,PVG_FT_Fixed miter_limit)

{
  PVG_FT_Fixed PVar1;
  
  stroker->radius = radius;
  stroker->line_cap = line_cap;
  stroker->line_join = line_join;
  PVar1 = 0x10000;
  if (0x10000 < miter_limit) {
    PVar1 = miter_limit;
  }
  stroker->miter_limit = PVar1;
  stroker->line_join_saved = line_join;
  stroker->borders[0].num_points = 0;
  stroker->borders[0].start = -1;
  stroker->borders[0].valid = '\0';
  stroker->borders[1].num_points = 0;
  stroker->borders[1].start = -1;
  stroker->borders[1].valid = '\0';
  return;
}

Assistant:

void PVG_FT_Stroker_Set(PVG_FT_Stroker stroker, PVG_FT_Fixed radius,
                       PVG_FT_Stroker_LineCap  line_cap,
                       PVG_FT_Stroker_LineJoin line_join,
                       PVG_FT_Fixed            miter_limit)
{
    stroker->radius = radius;
    stroker->line_cap = line_cap;
    stroker->line_join = line_join;
    stroker->miter_limit = miter_limit;

    /* ensure miter limit has sensible value */
    if (stroker->miter_limit < 0x10000) stroker->miter_limit = 0x10000;

    /* save line join style:                                           */
    /* line join style can be temporarily changed when stroking curves */
    stroker->line_join_saved = line_join;

    PVG_FT_Stroker_Rewind(stroker);
}